

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

bool __thiscall cursespp::Window::IsParentVisible(Window *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  
  cVar1 = '\x01';
  if (this->parent != (IWindow *)0x0) {
    iVar2 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x25])();
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    while ((plVar3 != (long *)0x0 && (cVar1 = (**(code **)(*plVar3 + 0x118))(plVar3), cVar1 != '\0')
           )) {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x128))(plVar3);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool Window::IsParentVisible() {
    ASSERT_MAIN_THREAD();

    if (this->parent == nullptr) {
        return true;
    }

    auto p = this->GetParent();
    while (p) {
        if (!p->IsVisible()) {
            return false;
        }
        p = p->GetParent();
    }

    return true;
}